

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O2

SHADER_TYPE Diligent::GetShaderTypeFromPipelineIndex(Int32 Index,PIPELINE_TYPE PipelineType)

{
  undefined *puVar1;
  undefined7 in_register_00000031;
  char (*in_R8) [50];
  Int32 Index_local;
  string msg;
  
  Index_local = Index;
  switch(CONCAT71(in_register_00000031,PipelineType) & 0xffffffff) {
  case 0:
    if ((uint)Index < 5) {
      puVar1 = &DAT_006697fc;
LAB_0046be81:
      return *(SHADER_TYPE *)(puVar1 + (ulong)(uint)Index * 4);
    }
    FormatString<char[7],int,char[47]>
              (&msg,(Diligent *)"Index ",(char (*) [7])&Index_local,
               (int *)" is not a valid graphics pipeline shader index",(char (*) [47])in_R8);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetShaderTypeFromPipelineIndex",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x8d2);
    break;
  case 1:
    if (Index == 0) {
      return SHADER_TYPE_COMPUTE;
    }
    FormatString<char[7],int,char[46]>
              (&msg,(Diligent *)"Index ",(char (*) [7])&Index_local,
               (int *)" is not a valid compute pipeline shader index",(char (*) [46])in_R8);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetShaderTypeFromPipelineIndex",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x8dc);
    break;
  case 2:
    if (Index == 0) {
      return SHADER_TYPE_AMPLIFICATION;
    }
    if (Index == 4) {
      return SHADER_TYPE_PIXEL;
    }
    if (Index == 1) {
      return SHADER_TYPE_MESH;
    }
    FormatString<char[7],int,char[43]>
              (&msg,(Diligent *)"Index ",(char (*) [7])&Index_local,
               (int *)" is not a valid mesh pipeline shader index",(char (*) [43])in_R8);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetShaderTypeFromPipelineIndex",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x8e8);
    break;
  case 3:
    if ((uint)Index < 6) {
      puVar1 = &DAT_00669810;
      goto LAB_0046be81;
    }
    FormatString<char[7],int,char[50]>
              (&msg,(Diligent *)"Index ",(char (*) [7])&Index_local,
               (int *)" is not a valid ray tracing pipeline shader index",in_R8);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetShaderTypeFromPipelineIndex",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x8f7);
    break;
  case 4:
    if (Index == 0) {
      return SHADER_TYPE_LAST;
    }
    FormatString<char[7],int,char[43]>
              (&msg,(Diligent *)"Index ",(char (*) [7])&Index_local,
               (int *)" is not a valid tile pipeline shader index",(char (*) [43])in_R8);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetShaderTypeFromPipelineIndex",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x901);
    break;
  default:
    FormatString<char[25]>(&msg,(char (*) [25])"Unexpected pipeline type");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetShaderTypeFromPipelineIndex",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x906);
  }
  std::__cxx11::string::~string((string *)&msg);
  return SHADER_TYPE_UNKNOWN;
}

Assistant:

SHADER_TYPE GetShaderTypeFromPipelineIndex(Int32 Index, PIPELINE_TYPE PipelineType)
{
    static_assert(SHADER_TYPE_LAST == 0x4000, "Please update the switch below to handle the new shader type");
    static_assert(PIPELINE_TYPE_LAST == 4, "Please update the switch below to handle the new pipeline type");
    switch (PipelineType)
    {
        case PIPELINE_TYPE_GRAPHICS:
            switch (Index)
            {
                case 0: return SHADER_TYPE_VERTEX;
                case 1: return SHADER_TYPE_HULL;
                case 2: return SHADER_TYPE_DOMAIN;
                case 3: return SHADER_TYPE_GEOMETRY;
                case 4: return SHADER_TYPE_PIXEL;

                default:
                    UNEXPECTED("Index ", Index, " is not a valid graphics pipeline shader index");
                    return SHADER_TYPE_UNKNOWN;
            }

        case PIPELINE_TYPE_COMPUTE:
            switch (Index)
            {
                case 0: return SHADER_TYPE_COMPUTE;

                default:
                    UNEXPECTED("Index ", Index, " is not a valid compute pipeline shader index");
                    return SHADER_TYPE_UNKNOWN;
            }

        case PIPELINE_TYPE_MESH:
            switch (Index)
            {
                case 0: return SHADER_TYPE_AMPLIFICATION;
                case 1: return SHADER_TYPE_MESH;
                case 4: return SHADER_TYPE_PIXEL;

                default:
                    UNEXPECTED("Index ", Index, " is not a valid mesh pipeline shader index");
                    return SHADER_TYPE_UNKNOWN;
            }

        case PIPELINE_TYPE_RAY_TRACING:
            switch (Index)
            {
                case 0: return SHADER_TYPE_RAY_GEN;
                case 1: return SHADER_TYPE_RAY_MISS;
                case 2: return SHADER_TYPE_RAY_CLOSEST_HIT;
                case 3: return SHADER_TYPE_RAY_ANY_HIT;
                case 4: return SHADER_TYPE_RAY_INTERSECTION;
                case 5: return SHADER_TYPE_CALLABLE;

                default:
                    UNEXPECTED("Index ", Index, " is not a valid ray tracing pipeline shader index");
                    return SHADER_TYPE_UNKNOWN;
            }

        case PIPELINE_TYPE_TILE:
            switch (Index)
            {
                case 0: return SHADER_TYPE_TILE;

                default:
                    UNEXPECTED("Index ", Index, " is not a valid tile pipeline shader index");
                    return SHADER_TYPE_UNKNOWN;
            }

        default:
            UNEXPECTED("Unexpected pipeline type");
            return SHADER_TYPE_UNKNOWN;
    }
}